

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata_impl.h
# Opt level: O3

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
::detach(QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
         *this)

{
  _Rb_tree_header *p_Var1;
  QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
  *pQVar2;
  QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
  *pQVar3;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->d).ptr;
  if (pQVar3 == (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
                 *)0x0) {
    pQVar3 = (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
              *)operator_new(0x38);
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> = (__atomic_base<int>)0x0;
    p_Var1 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header;
    (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (this->d).ptr = pQVar3;
    LOCK();
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  else if ((__int_type)
           (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int> != 1) {
    pQVar2 = (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
              *)operator_new(0x38);
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> = (__atomic_base<int>)0x0;
    std::
    _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QByteArray>,_std::_Select1st<std::pair<const_QByteArray,_QByteArray>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
    ::_Rb_tree(&(pQVar2->m)._M_t,&(pQVar3->m)._M_t);
    LOCK();
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
    local_28 = (QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                )(this->d).ptr;
    (this->d).ptr = pQVar2;
    ~QExplicitlySharedDataPointerV2(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void detach()
    {
        if (!d) {
            // should this codepath be here on in all user's detach()?
            d.reset(new T);
            d->ref.ref();
        } else if (d->ref.loadRelaxed() != 1) {
            // TODO: qAtomicDetach here...?
            QExplicitlySharedDataPointerV2 copy(new T(*d));
            swap(copy);
        }
    }